

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SparseMatrix.cpp
# Opt level: O0

string * __thiscall
iDynTree::SparseMatrix<(iDynTree::MatrixStorageOrdering)0>::description_abi_cxx11_
          (SparseMatrix<(iDynTree::MatrixStorageOrdering)0> *this,bool fullMatrix)

{
  bool bVar1;
  pointer pvVar2;
  ostream *poVar3;
  size_t sVar4;
  byte in_DL;
  SparseMatrix<(iDynTree::MatrixStorageOrdering)0> *in_RSI;
  string *in_RDI;
  double dVar5;
  size_t col;
  size_t row;
  const_iterator it;
  ostringstream stream;
  ConstIterator *in_stack_fffffffffffffd68;
  SparseMatrix<(iDynTree::MatrixStorageOrdering)0> *in_stack_fffffffffffffd70;
  ConstIterator *in_stack_fffffffffffffd78;
  ulong col_00;
  ulong row_00;
  SparseMatrix<(iDynTree::MatrixStorageOrdering)0> *in_stack_fffffffffffffd90;
  ulong local_210;
  ulong local_208;
  ConstIterator local_1c0;
  ostringstream local_190 [383];
  byte local_11;
  
  local_11 = in_DL & 1;
  std::__cxx11::ostringstream::ostringstream(local_190);
  if ((local_11 & 1) == 0) {
    begin(in_stack_fffffffffffffd70);
    while( true ) {
      end(in_stack_fffffffffffffd70);
      bVar1 = ConstIterator::operator!=
                        ((ConstIterator *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
      if (!bVar1) break;
      pvVar2 = ConstIterator::operator->(&local_1c0);
      poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_190,pvVar2->value);
      poVar3 = std::operator<<(poVar3,"(");
      pvVar2 = ConstIterator::operator->(&local_1c0);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,pvVar2->row);
      poVar3 = std::operator<<(poVar3,", ");
      pvVar2 = ConstIterator::operator->(&local_1c0);
      poVar3 = (ostream *)std::ostream::operator<<(poVar3,pvVar2->column);
      std::operator<<(poVar3,") ");
      ConstIterator::operator++(in_stack_fffffffffffffd78);
    }
  }
  else {
    local_208 = 0;
    while (row_00 = local_208, sVar4 = rows(in_RSI), row_00 < sVar4) {
      local_210 = 0;
      while (col_00 = local_210, sVar4 = columns(in_RSI), col_00 < sVar4) {
        dVar5 = operator()(in_stack_fffffffffffffd90,row_00,col_00);
        poVar3 = (ostream *)std::ostream::operator<<((ostream *)local_190,dVar5);
        std::operator<<(poVar3," ");
        local_210 = local_210 + 1;
      }
      std::ostream::operator<<((ostream *)local_190,std::endl<char,std::char_traits<char>>);
      local_208 = local_208 + 1;
    }
  }
  std::__cxx11::ostringstream::str();
  std::__cxx11::ostringstream::~ostringstream(local_190);
  return in_RDI;
}

Assistant:

std::string SparseMatrix<ordering>::description(bool fullMatrix) const
    {
        std::ostringstream stream;
        if (!fullMatrix) {
            for (const_iterator it = begin(); it != end(); ++it) {
                stream << it->value << "(" << it->row << ", " << it->column << ") ";
            }
        } else {
            for (std::size_t row = 0; row < rows(); ++row) {
                for (std::size_t col = 0; col < columns(); ++col) {
                    stream << this->operator()(row, col) << " ";
                }
                stream << std::endl;
            }

        }
        return stream.str();
    }